

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

Dict * tagsInstall(TidyDocImpl *doc,TidyTagImpl *tags,Dict *old)

{
  DictHash *pDVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  char cVar5;
  
  if (old != (Dict *)0x0) {
    pDVar1 = (DictHash *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x10);
    pDVar1->tag = old;
    pcVar4 = old->name;
    cVar5 = *pcVar4;
    uVar3 = 0;
    if (cVar5 != '\0') {
      do {
        pcVar4 = pcVar4 + 1;
        uVar2 = (int)uVar3 * 0x1f + (int)cVar5;
        uVar3 = (ulong)uVar2;
        cVar5 = *pcVar4;
      } while (cVar5 != '\0');
      uVar3 = (ulong)(uVar2 % 0xb2);
    }
    pDVar1->next = tags->hashtab[uVar3];
    tags->hashtab[uVar3] = pDVar1;
  }
  return old;
}

Assistant:

static const Dict *tagsInstall(TidyDocImpl* doc, TidyTagImpl* tags, const Dict* old)
{
    DictHash *np;
    uint hashval;

    if (old)
    {
        np = (DictHash *)TidyDocAlloc(doc, sizeof(*np));
        np->tag = old;

        hashval = tagsHash(old->name);
        np->next = tags->hashtab[hashval];
        tags->hashtab[hashval] = np;
    }

    return old;
}